

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_BitwiseShift<psy::C::AssignmentExpressionSyntax>
          (TypeChecker *this,AssignmentExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  BasicTypeKind BVar2;
  int iVar3;
  undefined4 extraout_var;
  Compilation *this_00;
  Type *pTVar4;
  Action AVar5;
  
  bVar1 = satisfyIntegerTypeConstraint
                    (this,leftTy,
                     &((node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).leftExpr_)->
                      super_SyntaxNode);
  AVar5 = Quit;
  if (bVar1) {
    bVar1 = satisfyIntegerTypeConstraint
                      (this,rightTy,
                       &((node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).rightExpr_)
                        ->super_SyntaxNode);
    if (bVar1) {
      iVar3 = (*leftTy->_vptr_Type[5])(leftTy);
      BVar2 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar3));
      BVar2 = performIntegerPromotion(BVar2);
      this_00 = SemanticModel::compilation(this->semaModel_);
      pTVar4 = &Compilation::canonicalBasicType(this_00,BVar2)->super_Type;
      this->ty_ = pTVar4;
      AVar5 = Skip;
    }
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_BitwiseShift(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (!(satisfyIntegerTypeConstraint(leftTy, node->left())
            && satisfyIntegerTypeConstraint(rightTy, node->right()))) {
        return Action::Quit;
    }
    auto promoTyK = performIntegerPromotion(leftTy->asBasicType()->kind());
    ty_ = semaModel_->compilation()->canonicalBasicType(promoTyK);

    return Action::Skip;
}